

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.h
# Opt level: O0

cmCommand * __thiscall cmQTWrapUICommand::Clone(cmQTWrapUICommand *this)

{
  cmCommand *this_00;
  cmQTWrapUICommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmQTWrapUICommand((cmQTWrapUICommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmQTWrapUICommand;
    }